

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_TakeStep(void *arkode_mem,realtype *dsmPtr,int *nflagPtr)

{
  N_Vector p_Var1;
  int iVar2;
  realtype *in_RDX;
  ARKodeMem in_RSI;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector *Xvecs;
  realtype *cvals;
  int nvec;
  int js;
  int is;
  int retval;
  N_Vector in_stack_ffffffffffffffa8;
  N_Vector *in_stack_ffffffffffffffb0;
  realtype *in_stack_ffffffffffffffb8;
  N_Vector p_Var3;
  int local_30;
  int local_2c;
  uint local_28;
  int local_4;
  
  *(undefined4 *)in_RDX = 0;
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                       (ARKodeMem *)in_stack_ffffffffffffffa8,(ARKodeERKStepMem *)0x1143869);
  if (local_4 == 0) {
    p_Var1 = in_stack_ffffffffffffffb0[6];
    p_Var3 = in_stack_ffffffffffffffb0[7];
    for (local_28 = 1; (int)local_28 < *(int *)(in_stack_ffffffffffffffb0 + 3);
        local_28 = local_28 + 1) {
      in_stack_ffffffffffffffb8[0x33] =
           *(double *)((long)in_stack_ffffffffffffffb0[4][1].content + (long)(int)local_28 * 8) *
           in_stack_ffffffffffffffb8[0x2d] + in_stack_ffffffffffffffb8[0x46];
      if (*(int *)(in_stack_ffffffffffffffb8 + 0x40) != 0) {
        fprintf((FILE *)in_stack_ffffffffffffffb8[0x41],"ERKStep  step  %li  %.16g  %i  %.16g\n",
                in_stack_ffffffffffffffb8[0x2d],in_stack_ffffffffffffffb8[0x33],
                in_stack_ffffffffffffffb8[0x3b],(ulong)local_28);
      }
      local_30 = 0;
      for (local_2c = 0; local_2c < (int)local_28; local_2c = local_2c + 1) {
        (&p_Var1->content)[local_30] =
             (void *)(in_stack_ffffffffffffffb8[0x2d] *
                     *(double *)
                      ((&in_stack_ffffffffffffffb0[4]->sunctx->profiler)[(int)local_28] +
                      (long)local_2c * 8));
        (&p_Var3->content)[local_30] = (&in_stack_ffffffffffffffb0[1]->content)[local_2c];
        local_30 = local_30 + 1;
      }
      (&p_Var1->content)[local_30] = (void *)0x3ff0000000000000;
      (&p_Var3->content)[local_30] = (void *)in_stack_ffffffffffffffb8[0x22];
      iVar2 = N_VLinearCombination
                        ((int)((ulong)p_Var3 >> 0x20),in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (iVar2 != 0) {
        return -0x1c;
      }
      if ((in_stack_ffffffffffffffb8[0x53] != 0.0) &&
         (iVar2 = (*(code *)in_stack_ffffffffffffffb8[0x53])
                            (in_stack_ffffffffffffffb8[0x33],in_stack_ffffffffffffffb8[0x21],
                             in_stack_ffffffffffffffb8[2]), iVar2 != 0)) {
        return -0x26;
      }
      iVar2 = (*(code *)*in_stack_ffffffffffffffb0)
                        (in_stack_ffffffffffffffb8[0x33],in_stack_ffffffffffffffb8[0x21],
                         (&in_stack_ffffffffffffffb0[1]->content)[(int)local_28],
                         in_stack_ffffffffffffffb8[2]);
      in_stack_ffffffffffffffb0[5] = (N_Vector)((long)&in_stack_ffffffffffffffb0[5]->content + 1);
      if (iVar2 < 0) {
        return -8;
      }
      if (0 < iVar2) {
        return -0xb;
      }
    }
    local_4 = erkStep_ComputeSolutions(in_RSI,in_RDX);
    if (-1 < local_4) {
      if (*(int *)(in_stack_ffffffffffffffb8 + 0x40) != 0) {
        fprintf((FILE *)in_stack_ffffffffffffffb8[0x41],"ERKStep  etest  %li  %.16g  %.16g\n",
                in_stack_ffffffffffffffb8[0x2d],in_RSI->sunctx,in_stack_ffffffffffffffb8[0x3b]);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int erkStep_TakeStep(void* arkode_mem, realtype *dsmPtr, int *nflagPtr)
{
  int retval, is, js, nvec;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success */
  *nflagPtr = ARK_SUCCESS;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "erkStep_TakeStep",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ERKStep step %li,  stage 0,  h = %"RSYM",  t_n = %"RSYM"\n",
         ark_mem->nst, ark_mem->h, ark_mem->tcur);
#endif

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ERKStep stage 0 solution:\n");
  N_VPrint(ark_mem->ycur);
  printf("    ERKStep stage RHS F[0]:\n");
  N_VPrint(step_mem->F[0]);
#endif

  /* Loop over internal stages to the step; since the method is explicit
     the first stage RHS is just the full RHS from the start of the step */
  for (is=1; is<step_mem->stages; is++) {

    /* Set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + step_mem->B->c[is]*ark_mem->h;

#ifdef SUNDIALS_DEBUG
    printf("    ERKStep step %li,  stage %i,  h = %"RSYM",  t_n = %"RSYM"\n",
           ark_mem->nst, is, ark_mem->h, ark_mem->tcur);
#endif

    /* Solver diagnostics reporting */
    if (ark_mem->report)
      fprintf(ark_mem->diagfp, "ERKStep  step  %li  %"RSYM"  %i  %"RSYM"\n",
              ark_mem->nst, ark_mem->h, is, ark_mem->tcur);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                       "ARKODE::erkStep_TakeStep", "start-step",
                       "step = %li, h = "RSYM", stage = %i, tcur = %"RSYM,
                       ark_mem->nst, ark_mem->h, is, ark_mem->tcur);
#endif

    /* Set ycur to current stage solution */
    nvec = 0;
    for (js=0; js<is; js++) {
      cvals[nvec] = ark_mem->h * step_mem->B->A[is][js];
      Xvecs[nvec] = step_mem->F[js];
      nvec += 1;
    }
    cvals[nvec] = ONE;
    Xvecs[nvec] = ark_mem->yn;
    nvec += 1;

    /*   call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, ark_mem->ycur);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL) {
      retval = ark_mem->ProcessStage(ark_mem->tcur,
                                     ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) return(ARK_POSTPROCESS_STAGE_FAIL);
    }

    /* compute updated RHS */
    retval = step_mem->f(ark_mem->tcur, ark_mem->ycur,
                         step_mem->F[is], ark_mem->user_data);
    step_mem->nfe++;
    if (retval < 0)  return(ARK_RHSFUNC_FAIL);
    if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ERKStep stage RHS F[%i]:\n",is);
    N_VPrint(step_mem->F[is]);
#endif

  } /* loop over stages */

  /* compute time-evolved solution (in ark_ycur), error estimate (in dsm) */
  retval = erkStep_ComputeSolutions(ark_mem, dsmPtr);
  if (retval < 0)  return(retval);

#ifdef SUNDIALS_DEBUG
  printf("    ERKStep error estimate = %"RSYM"\n", *dsmPtr);
#endif
#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ERKStep updated solution:\n");
  N_VPrint(ark_mem->ycur);
#endif

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "ERKStep  etest  %li  %"RSYM"  %"RSYM"\n",
            ark_mem->nst, ark_mem->h, *dsmPtr);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::erkStep_TakeStep", "error-test",
                     "step = %li, h = "RSYM", dsm = %"RSYM,
                     ark_mem->nst, ark_mem->h, *dsmPtr);
#endif

  return(ARK_SUCCESS);
}